

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

bool __thiscall
ThreadContext::IsIsInstInlineCacheInList
          (ThreadContext *this,IsInstInlineCache *inlineCache,IsInstInlineCache *inlineCacheList)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IsInstInlineCache *curInlineCache;
  
  if (inlineCache == (IsInstInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf64,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) goto LAB_007c0ae8;
    *puVar3 = 0;
  }
  if (inlineCacheList == (IsInstInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf65,"(inlineCacheList != nullptr)","inlineCacheList != nullptr");
    if (!bVar2) {
LAB_007c0ae8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = inlineCacheList != (IsInstInlineCache *)0x0;
  if (inlineCacheList != inlineCache && bVar2) {
    do {
      inlineCacheList = inlineCacheList->next;
      bVar2 = inlineCacheList != (IsInstInlineCache *)0x0;
      if (inlineCacheList == inlineCache) {
        return bVar2;
      }
    } while (inlineCacheList != (IsInstInlineCache *)0x0);
  }
  return bVar2;
}

Assistant:

bool
ThreadContext::IsIsInstInlineCacheInList(const Js::IsInstInlineCache* inlineCache, const Js::IsInstInlineCache* inlineCacheList)
{
    Assert(inlineCache != nullptr);
    Assert(inlineCacheList != nullptr);

    for (const Js::IsInstInlineCache* curInlineCache = inlineCacheList; curInlineCache != nullptr; curInlineCache = curInlineCache->next)
    {
        if (curInlineCache == inlineCache)
        {
            return true;
        }
    }

    return false;
}